

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_shl_8(c_v256 *__return_storage_ptr__,c_v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  c_v256 cVar8;
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  auVar10 = in_ZMM0._0_32_;
  if (c < 8) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64[3];
    auVar10 = vpmovzxbd_avx2(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a.u64[2];
    auVar12 = vpmovzxbd_avx2(auVar2);
    auVar5 = vpslld_avx2(auVar10,ZEXT416(c));
    auVar13 = vpslld_avx2(auVar12,ZEXT416(c));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = a.u64[0];
    auVar10 = vpmovzxbd_avx2(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = a.u64[1];
    auVar12 = vpmovzxbd_avx2(auVar4);
    auVar6 = vpslld_avx2(auVar12,ZEXT416(c));
    auVar7 = vpslld_avx2(auVar10,ZEXT416(c));
    auVar10 = vperm2i128_avx2(auVar13,auVar5,0x31);
    auVar14._8_4_ = 0xc080400;
    auVar14._0_8_ = 0xc0804000c080400;
    auVar14._12_4_ = 0xc080400;
    auVar14._16_4_ = 0xc080400;
    auVar14._20_4_ = 0xc080400;
    auVar14._24_4_ = 0xc080400;
    auVar14._28_4_ = 0xc080400;
    auVar10 = vpshufb_avx2(auVar10,auVar14);
    auVar11._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar13._0_16_;
    auVar11._16_16_ = ZEXT116(0) * auVar13._16_16_ + ZEXT116(1) * auVar5._0_16_;
    auVar12 = vpshufb_avx2(auVar11,auVar14);
    auVar5 = vpunpckldq_avx2(auVar12,auVar10);
    auVar10 = vperm2i128_avx2(auVar7,auVar6,0x31);
    auVar10 = vpshufb_avx2(auVar10,auVar14);
    auVar13._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar7._0_16_;
    auVar13._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar6._0_16_;
    auVar12 = vpshufb_avx2(auVar13,auVar14);
    auVar10 = vpunpckldq_avx2(auVar12,auVar10);
    auVar10 = vpunpcklqdq_avx2(auVar10,auVar5);
    cVar8 = (c_v256)vpermq_avx2(auVar10,0xd8);
    *__return_storage_ptr__ = cVar8;
    return __return_storage_ptr__;
  }
  c_v256_shl_8();
  uVar9 = 0xff << ((byte)c & 0x1f);
  auVar12[0] = (undefined1)uVar9;
  auVar12[1] = auVar12[0];
  auVar12[2] = auVar12[0];
  auVar12[3] = auVar12[0];
  auVar12[4] = auVar12[0];
  auVar12[5] = auVar12[0];
  auVar12[6] = auVar12[0];
  auVar12[7] = auVar12[0];
  auVar12[8] = auVar12[0];
  auVar12[9] = auVar12[0];
  auVar12[10] = auVar12[0];
  auVar12[0xb] = auVar12[0];
  auVar12[0xc] = auVar12[0];
  auVar12[0xd] = auVar12[0];
  auVar12[0xe] = auVar12[0];
  auVar12[0xf] = auVar12[0];
  auVar12[0x10] = auVar12[0];
  auVar12[0x11] = auVar12[0];
  auVar12[0x12] = auVar12[0];
  auVar12[0x13] = auVar12[0];
  auVar12[0x14] = auVar12[0];
  auVar12[0x15] = auVar12[0];
  auVar12[0x16] = auVar12[0];
  auVar12[0x17] = auVar12[0];
  auVar12[0x18] = auVar12[0];
  auVar12[0x19] = auVar12[0];
  auVar12[0x1a] = auVar12[0];
  auVar12[0x1b] = auVar12[0];
  auVar12[0x1c] = auVar12[0];
  auVar12[0x1d] = auVar12[0];
  auVar12[0x1e] = auVar12[0];
  auVar12[0x1f] = auVar12[0];
  auVar10 = vpsllw_avx2(auVar10,ZEXT416(c));
  vpand_avx2(auVar10,auVar12);
  return (c_v256 *)(ulong)uVar9;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shl_8(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shl_8(a.v128[1], c),
                          c_v128_shl_8(a.v128[0], c));
}